

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tx.c
# Opt level: O0

_Bool tx_roundtrip(char *tx_hex)

{
  int iVar1;
  ulong uStack_50;
  int ret;
  size_t i;
  char *new_hex;
  wally_tx_output *new_out;
  wally_tx_output *out;
  wally_tx_input *new_in;
  wally_tx_input *in;
  wally_tx *tx;
  char *tx_hex_local;
  
  tx = (wally_tx *)tx_hex;
  iVar1 = wally_tx_from_hex(tx_hex,1,(wally_tx **)&in);
  if (((iVar1 != 0) || (iVar1 = wally_tx_to_hex((wally_tx *)in,1,(char **)&i), iVar1 != 0)) ||
     (iVar1 = strcmp((char *)tx,(char *)i), iVar1 != 0)) {
    return false;
  }
  iVar1 = wally_free_string((char *)i);
  if (iVar1 != 0) {
    return false;
  }
  new_in = *(wally_tx_input **)(in->txhash + 8);
  iVar1 = wally_tx_input_init_alloc
                    (new_in->txhash,0x20,new_in->index,new_in->sequence,new_in->script,
                     new_in->script_len,new_in->witness,(wally_tx_input **)&out);
  if (iVar1 != 0) {
    return false;
  }
  for (uStack_50 = 0; uStack_50 < 5; uStack_50 = uStack_50 + 1) {
    iVar1 = wally_tx_add_input((wally_tx *)in,(wally_tx_input *)out);
    if (iVar1 != 0) {
      return false;
    }
  }
  iVar1 = wally_tx_remove_input((wally_tx *)in,5);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_add_raw_input
                    ((wally_tx *)in,(uchar *)out,0x20,*(uint32_t *)&out->asset,
                     *(uint32_t *)((long)&out->asset + 4),(uchar *)out->asset_len,(size_t)out->value
                     ,(wally_tx_witness_stack *)out->value_len,0);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_input((wally_tx *)in,3);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_input((wally_tx *)in,2);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_input((wally_tx *)in,0);
  if (iVar1 != 0) {
    return false;
  }
  new_out = *(wally_tx_output **)&in->index;
  iVar1 = wally_tx_output_init_alloc
                    (new_out->satoshi,new_out->script,new_out->script_len,
                     (wally_tx_output **)&new_hex);
  if (iVar1 != 0) {
    return false;
  }
  for (uStack_50 = 0; uStack_50 < 5; uStack_50 = uStack_50 + 1) {
    iVar1 = wally_tx_add_output((wally_tx *)in,(wally_tx_output *)new_hex);
    if (iVar1 != 0) {
      return false;
    }
  }
  iVar1 = wally_tx_remove_output((wally_tx *)in,5);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_add_raw_output
                    ((wally_tx *)in,*(uint64_t *)new_hex,*(uchar **)(new_hex + 8),
                     *(size_t *)(new_hex + 0x10),0);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_output((wally_tx *)in,3);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_output((wally_tx *)in,2);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_remove_output((wally_tx *)in,0);
  if (iVar1 == 0) {
    iVar1 = wally_tx_free((wally_tx *)in);
    if (iVar1 != 0) {
      return false;
    }
    iVar1 = wally_tx_input_free((wally_tx_input *)out);
    if (iVar1 == 0) {
      iVar1 = wally_tx_output_free((wally_tx_output *)new_hex);
      if (iVar1 == 0) {
        return true;
      }
      return false;
    }
    return false;
  }
  return false;
}

Assistant:

static bool tx_roundtrip(const char *tx_hex)
{
    struct wally_tx *tx;
    struct wally_tx_input *in, *new_in;
    struct wally_tx_output *out, *new_out;
    char *new_hex;
    size_t i;
    int ret;

    /* Unserialize and serialize the tx and verify they match */
    ret = wally_tx_from_hex(tx_hex, WALLY_TX_FLAG_USE_WITNESS, &tx);
    check_ret(ret);

    ret = wally_tx_to_hex(tx, WALLY_TX_FLAG_USE_WITNESS, &new_hex);
    if (ret != WALLY_OK || strcmp(tx_hex, new_hex))
        return false;

    ret = wally_free_string(new_hex);
    check_ret(ret);

    /* Test adding and removing inputs */
    in = &tx->inputs[0];
    ret = wally_tx_input_init_alloc(in->txhash, sizeof(in->txhash),
                                    in->index, in->sequence,
                                    in->script, in->script_len, in->witness,
                                    &new_in);
    check_ret(ret);

    for (i = 0; i < 5; ++i) {
        ret = wally_tx_add_input(tx, new_in);
        check_ret(ret);
    }
    ret = wally_tx_remove_input(tx, 5); /* Remove last */
    check_ret(ret);
    ret = wally_tx_add_raw_input(tx, new_in->txhash, WALLY_TXHASH_LEN,
                                 new_in->index, new_in->sequence,
                                 new_in->script, new_in->script_len,
                                 new_in->witness, 0);
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 3); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 2); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 0); /* Remove first */
    check_ret(ret);

    /* Test adding and removing outputs */
    out = &tx->outputs[0];
    ret = wally_tx_output_init_alloc(out->satoshi,
                                     out->script, out->script_len, &new_out);
    check_ret(ret);

    for (i = 0; i < 5; ++i) {
        ret = wally_tx_add_output(tx, new_out);
        check_ret(ret);
    }

    ret = wally_tx_remove_output(tx, 5); /* Remove last */
    check_ret(ret);
    ret = wally_tx_add_raw_output(tx, new_out->satoshi, new_out->script, new_out->script_len, 0);
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 3); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 2); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 0); /* Remove first */
    check_ret(ret);

    /* Clean up (for valgrind heap checking) */
    ret = wally_tx_free(tx);
    check_ret(ret);
    ret = wally_tx_input_free(new_in);
    check_ret(ret);
    ret = wally_tx_output_free(new_out);
    check_ret(ret);
    return true;
}